

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FloatStateQueryVerifiers::GetBooleanVerifier::verifyFloat4Color
          (GetBooleanVerifier *this,TestContext *testCtx,GLenum name,GLfloat reference0,
          GLfloat reference1,GLfloat reference2,GLfloat reference3)

{
  bool bVar1;
  qpTestResult qVar2;
  uchar (*pauVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8 [3];
  MessageBuilder local_1c0;
  undefined1 local_3c [8];
  StateQueryMemoryWriteGuard<unsigned_char[4]> boolVector4;
  GLboolean referenceAsGLBoolean [4];
  GLfloat reference3_local;
  GLfloat reference2_local;
  GLfloat reference1_local;
  GLfloat reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetBooleanVerifier *this_local;
  
  boolVector4.m_value[0] = reference0 != 0.0;
  boolVector4.m_value[1] = reference1 != 0.0;
  boolVector4.m_value[2] = reference2 != 0.0;
  boolVector4.m_value[3] = -(reference3 != 0.0) & 1;
  boolVector4.m_postguard = (uchar  [4])reference3;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::
  StateQueryMemoryWriteGuard((StateQueryMemoryWriteGuard<unsigned_char[4]> *)local_3c);
  pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_3c);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,*pauVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<unsigned_char[4]> *)local_3c,testCtx);
  if ((bVar1) &&
     ((((pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_3c),
        (*pauVar3)[0] != boolVector4.m_value[0] ||
        (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_3c),
        (*pauVar3)[1] != boolVector4.m_value[1])) ||
       (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_3c),
       (*pauVar3)[2] != boolVector4.m_value[2])) ||
      (pauVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_3c),
      (*pauVar3)[3] != boolVector4.m_value[3])))) {
    this_00 = tcu::TestContext::getLog(testCtx);
    tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [20])"// ERROR: expected ");
    local_1d8[0] = "mapped_ == GL_FALSE";
    if (boolVector4.m_value[0] != '\0') {
      local_1d8[0] = "mapped_ == GL_TRUE";
    }
    local_1d8[0] = local_1d8[0] + 0xb;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1d8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
    local_1e0 = "mapped_ == GL_FALSE";
    if (boolVector4.m_value[1] != '\0') {
      local_1e0 = "mapped_ == GL_TRUE";
    }
    local_1e0 = local_1e0 + 0xb;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
    local_1e8 = "mapped_ == GL_FALSE";
    if (boolVector4.m_value[2] != '\0') {
      local_1e8 = "mapped_ == GL_TRUE";
    }
    local_1e8 = local_1e8 + 0xb;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2c6cdd6);
    local_1f0 = "mapped_ == GL_FALSE";
    if (boolVector4.m_value[3] != '\0') {
      local_1f0 = "mapped_ == GL_TRUE";
    }
    local_1f0 = local_1f0 + 0xb;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f0);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    qVar2 = tcu::TestContext::getTestResult(testCtx);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid boolean value");
    }
  }
  return;
}

Assistant:

void GetBooleanVerifier::verifyFloat4Color (tcu::TestContext& testCtx, GLenum name, GLfloat reference0, GLfloat reference1, GLfloat reference2, GLfloat reference3)
{
	using tcu::TestLog;

	const GLboolean referenceAsGLBoolean[] =
	{
		reference0 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference1 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference2 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
		reference3 != 0.0f ? GLboolean(GL_TRUE) : GLboolean(GL_FALSE),
	};

	StateQueryMemoryWriteGuard<GLboolean[4]> boolVector4;
	glGetBooleanv(name, boolVector4);

	if (!boolVector4.verifyValidity(testCtx))
		return;

	if (boolVector4[0] != referenceAsGLBoolean[0] ||
		boolVector4[1] != referenceAsGLBoolean[1] ||
		boolVector4[2] != referenceAsGLBoolean[2] ||
		boolVector4[3] != referenceAsGLBoolean[3])
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (referenceAsGLBoolean[0] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[1] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[2] ? "GL_TRUE" : "GL_FALSE") << " "
			<< (referenceAsGLBoolean[3] ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid boolean value");
	}
}